

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyimpl.cpp
# Opt level: O2

void __thiscall QNetworkReplyImpl::~QNetworkReplyImpl(QNetworkReplyImpl *this)

{
  QNetworkReplyImplPrivate *this_00;
  bool bVar1;
  QAbstractNetworkCache *pQVar2;
  long in_FS_OFFSET;
  QNetworkReply QStack_28;
  
  QStack_28._8_8_ = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined ***)this = &PTR_metaObject_002ca7e0;
  this_00 = *(QNetworkReplyImplPrivate **)(this + 8);
  bVar1 = QNetworkReplyImplPrivate::isCachingEnabled(this_00);
  if (bVar1) {
    pQVar2 = QNetworkReplyImplPrivate::networkCache(this_00);
    QNetworkReply::url(&QStack_28);
    (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&QStack_28);
    QUrl::~QUrl((QUrl *)&QStack_28);
  }
  QNetworkReply::~QNetworkReply((QNetworkReply *)this);
  if (*(long *)(in_FS_OFFSET + 0x28) == QStack_28._8_8_) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QNetworkReplyImpl::~QNetworkReplyImpl()
{
    Q_D(QNetworkReplyImpl);

    // This code removes the data from the cache if it was prematurely aborted.
    // See QNetworkReplyImplPrivate::completeCacheSave(), we disable caching there after the cache
    // save had been properly finished. So if it is still enabled it means we got deleted/aborted.
    if (d->isCachingEnabled())
        d->networkCache()->remove(url());
}